

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h261.c
# Opt level: O1

int h261_gob(bitstream *str,h261_gob *gob)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint32_t *puVar5;
  long lVar6;
  h261_macroblock *val;
  int32_t (*paiVar7) [64];
  ulong uVar8;
  uint32_t mba;
  uint32_t gei;
  uint32_t local_6c;
  uint32_t local_68;
  uint32_t local_64;
  uint32_t *local_60;
  h261_macroblock *local_58;
  uint32_t *local_50;
  int local_44;
  int32_t (*local_40) [64];
  h261_macroblock *local_38;
  
  iVar2 = vs_u(str,&gob->gquant,5);
  if (iVar2 == 0) {
    local_64 = 0;
    iVar2 = vs_u(str,&local_64,1);
    if (iVar2 == 0) {
      do {
        if (local_64 == 0) {
          local_68 = gob->gquant;
          local_38 = gob->mbs;
          local_50 = &gob->mbs[0].cbp;
          uVar8 = 0;
          goto LAB_00102855;
        }
        iVar2 = vs_u(str,&local_64,8);
      } while ((iVar2 == 0) && (iVar2 = vs_u(str,&local_64,1), iVar2 == 0));
    }
  }
  return 1;
LAB_00102855:
  local_6c = 0;
  if (str->dir == VS_ENCODE) {
    iVar2 = (int)uVar8;
    if (iVar2 < 0x21) {
      puVar5 = local_50 + (long)iVar2 * 0x185;
      lVar6 = 0;
      do {
        if (((h261_macroblock *)(puVar5 + -4))->mtype != 0) {
          uVar8 = (ulong)(uint)(iVar2 - (int)lVar6);
          goto LAB_001028c5;
        }
        iVar3 = vs_infer(str,puVar5,0);
        if (iVar3 != 0) {
          uVar8 = (ulong)(uint)(iVar2 - (int)lVar6);
          goto LAB_00102a39;
        }
        local_6c = local_6c + 1;
        lVar6 = lVar6 + -1;
        puVar5 = puVar5 + 0x185;
      } while ((long)iVar2 + -0x21 != lVar6);
      uVar8 = 0x21;
    }
LAB_001028c5:
    if ((int)uVar8 != 0x21) goto LAB_001028d9;
    uVar8 = 0x21;
  }
  else {
LAB_001028d9:
    do {
      iVar3 = vs_vlc(str,&local_6c,mba_vlc);
      iVar2 = 1;
      if (iVar3 != 0) goto LAB_00102a04;
      iVar3 = (int)uVar8;
      if ((str->dir == VS_ENCODE) || (local_6c < 0x21)) {
        if (str->dir != VS_DECODE) goto LAB_001029df;
        if ((0x20 < iVar3) || (local_6c == 0)) goto LAB_001029c9;
        puVar5 = local_50 + (long)iVar3 * 0x185;
        uVar4 = (long)iVar3;
        goto LAB_00102987;
      }
    } while (local_6c == 0x21);
    if (iVar3 < 0x21) {
      puVar5 = local_50 + (long)iVar3 * 0x185;
      lVar6 = 0;
LAB_00102923:
      ((h261_macroblock *)(puVar5 + -4))->mtype = 0;
      iVar2 = vs_infer(str,puVar5,0);
      if (iVar2 == 0) goto code_r0x00102940;
      uVar8 = (ulong)(uint)(iVar3 - (int)lVar6);
LAB_00102a39:
      bVar1 = false;
      iVar2 = 1;
      goto LAB_00102a4d;
    }
  }
  bVar1 = false;
  iVar2 = 0;
  goto LAB_00102a4d;
  while( true ) {
    uVar8 = uVar4 + 1;
    local_6c = local_6c - 1;
    if ((0x1f < (long)uVar4) || (puVar5 = puVar5 + 0x185, uVar4 = uVar8, local_6c == 0)) break;
LAB_00102987:
    ((h261_macroblock *)(puVar5 + -4))->mtype = 0;
    bVar1 = false;
    iVar3 = vs_infer(str,puVar5,0);
    if (iVar3 != 0) {
      uVar8 = uVar4 & 0xffffffff;
      goto LAB_00102a4d;
    }
  }
LAB_001029c9:
  if ((int)uVar8 == 0x21) {
    h261_gob_cold_1();
    uVar8 = 0x21;
  }
  else {
LAB_001029df:
    val = local_38 + (int)uVar8;
    iVar3 = vs_vlc(str,&val->mtype,mtype_vlc);
    if (iVar3 == 0) {
      if ((val->mtype & 3) == 0) {
LAB_00102a7d:
        local_58 = val;
        if (((val->mtype & 8) == 0) ||
           ((iVar3 = vs_vlc(str,val->mvd,mvd_vlc), val = local_58, iVar3 == 0 &&
            (iVar3 = vs_vlc(str,local_58->mvd + 1,mvd_vlc), iVar3 == 0)))) {
          puVar5 = &val->cbp;
          if ((val->mtype & 1) == 0) {
            if ((val->mtype & 2) != 0) {
              iVar3 = vs_infer(str,puVar5,0x3f);
              goto LAB_00102b09;
            }
            bVar1 = false;
            iVar3 = vs_infer(str,puVar5,0);
            if (iVar3 != 0) goto LAB_00102a4d;
          }
          else {
            iVar3 = vs_vlc(str,puVar5,cbp_vlc);
LAB_00102b09:
            if (iVar3 != 0) goto LAB_00102a04;
          }
          paiVar7 = local_58->block;
          puVar5 = (uint32_t *)0x0;
          local_40 = paiVar7;
          do {
            local_60 = puVar5;
            if ((local_58->cbp >> ((uint)puVar5 & 0x1f) & 1) == 0) {
              lVar6 = 0;
              do {
                bVar1 = false;
                iVar3 = vs_infers(str,(int32_t *)((long)*paiVar7 + lVar6),0);
                if (iVar3 != 0) goto LAB_00102a4d;
                lVar6 = lVar6 + 4;
              } while (lVar6 != 0x100);
            }
            else {
              iVar3 = h261_block(str,local_40[(long)puVar5],local_58->mtype & 2);
              if (iVar3 != 0) goto LAB_00102a39;
            }
            puVar5 = (uint32_t *)((long)local_60 + 1);
            paiVar7 = paiVar7 + 1;
          } while (puVar5 != (uint32_t *)0x6);
          uVar8 = (ulong)((int)uVar8 + 1);
          bVar1 = true;
          iVar2 = local_44;
          goto LAB_00102a4d;
        }
      }
      else {
        puVar5 = &val->mquant;
        if ((val->mtype & 4) == 0) {
          iVar3 = vs_infer(str,puVar5,local_68);
          if (iVar3 == 0) goto LAB_00102a7d;
        }
        else {
          local_60 = puVar5;
          iVar3 = vs_u(str,puVar5,5);
          if (iVar3 == 0) {
            local_68 = *local_60;
            goto LAB_00102a7d;
          }
        }
      }
    }
  }
LAB_00102a04:
  bVar1 = false;
LAB_00102a4d:
  local_44 = iVar2;
  if (!bVar1) {
    return iVar2;
  }
  goto LAB_00102855;
code_r0x00102940:
  lVar6 = lVar6 + -1;
  puVar5 = puVar5 + 0x185;
  if ((long)iVar3 + -0x21 == lVar6) goto code_r0x0010294f;
  goto LAB_00102923;
code_r0x0010294f:
  bVar1 = false;
  uVar8 = 0x21;
  iVar2 = 0;
  goto LAB_00102a4d;
}

Assistant:

int h261_gob(struct bitstream *str, struct h261_gob *gob) {
	if (vs_u(str, &gob->gquant, 5)) return 1;
	uint32_t gei = 0;
	if (vs_u(str, &gei, 1)) return 1;
	while (gei) {
		if (vs_u(str, &gei, 8)) return 1;
		if (vs_u(str, &gei, 1)) return 1;
	}
	int mbi = 0;
	uint32_t quant = gob->gquant;
	while (1) {
		uint32_t mba = 0;
		if (str->dir == VS_ENCODE) {
			while (mbi < H261_GOB_MBS && gob->mbs[mbi].mtype == 0) {
				if (vs_infer(str, &gob->mbs[mbi].cbp, 0)) return 1;
				mbi++, mba++;
			}
		       	if (mbi == H261_GOB_MBS)
				return 0;
		}
		while (1) {
			if (vs_vlc(str, &mba, mba_vlc)) return 1;
			if (str->dir == VS_ENCODE || mba < 33)
				break;
			if (mba == 33) /* stuffing */
				continue;
			/* end */
			while (mbi < H261_GOB_MBS) {
				gob->mbs[mbi].mtype = 0;
				if (vs_infer(str, &gob->mbs[mbi].cbp, 0)) return 1;
				mbi++;
			}
			return 0;
		}
		if (str->dir == VS_DECODE) {
			while (mbi < H261_GOB_MBS && mba) {
				gob->mbs[mbi].mtype = 0;
				if (vs_infer(str, &gob->mbs[mbi].cbp, 0)) return 1;
				mbi++, mba--;
			}
			if (mbi == H261_GOB_MBS) {
				fprintf(stderr, "Macroblock address overrun\n");
				return 1;
			}
		}
		struct h261_macroblock *mb = &gob->mbs[mbi];
		if (vs_vlc(str, &mb->mtype, mtype_vlc)) return 1;
		if (mb->mtype & (H261_MTYPE_FLAG_CODED | H261_MTYPE_FLAG_INTRA)) {
			if (mb->mtype & H261_MTYPE_FLAG_QUANT) {
				if (vs_u(str, &mb->mquant, 5)) return 1;
				quant = mb->mquant;
			} else {
				if (vs_infer(str, &mb->mquant, quant)) return 1;
			}
		}
		if (mb->mtype & H261_MTYPE_FLAG_MC) {
			if (vs_vlc(str, &mb->mvd[0], mvd_vlc)) return 1;
			if (vs_vlc(str, &mb->mvd[1], mvd_vlc)) return 1;
		}
		if (mb->mtype & H261_MTYPE_FLAG_CODED) {
			if (vs_vlc(str, &mb->cbp, cbp_vlc)) return 1;
		} else if (mb->mtype & H261_MTYPE_FLAG_INTRA) {
			if (vs_infer(str, &mb->cbp, 0x3f)) return 1;
		} else {
			if (vs_infer(str, &mb->cbp, 0)) return 1;
		}
		int j, k;
		for (j = 0; j < 6; j++) {
			if (mb->cbp & (1 << j)) {
				if (h261_block(str, mb->block[j], mb->mtype & H261_MTYPE_FLAG_INTRA)) return 1;
			} else {
				for (k = 0; k < 64; k++)
					if (vs_infers(str, &mb->block[j][k], 0)) return 1;
			}
		}
		mbi++;
	}
	return 0;
}